

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

void __thiscall SimpleString::SimpleString(SimpleString *this,char *otherBuffer)

{
  size_t sVar1;
  
  this->buffer_ = (char *)0x0;
  this->bufferSize_ = 0;
  if (otherBuffer == (char *)0x0) {
    setInternalBufferAsEmptyString(this);
    return;
  }
  sVar1 = StrLen(otherBuffer);
  copyBufferToNewInternalBuffer(this,otherBuffer,sVar1 + 1);
  return;
}

Assistant:

SimpleString::SimpleString(const char *otherBuffer)
    : buffer_(NULLPTR), bufferSize_(0)
{
    if (otherBuffer == NULLPTR)
        setInternalBufferAsEmptyString();
    else
        copyBufferToNewInternalBuffer(otherBuffer);
}